

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

bool Emitter::addEmitter(Junction *junc,double c,double e,Pattern *p)

{
  Emitter *pEVar1;
  
  if (junc->emitter == (Emitter *)0x0) {
    pEVar1 = (Emitter *)operator_new(0x18);
    Emitter(pEVar1);
    junc->emitter = pEVar1;
  }
  pEVar1 = junc->emitter;
  pEVar1->flowCoeff = c;
  pEVar1->expon = e;
  pEVar1->timePattern = p;
  return true;
}

Assistant:

bool Emitter::addEmitter(Junction* junc, double c, double e, Pattern* p)
{
    if ( junc->emitter == nullptr )
    {
        junc->emitter = new Emitter();
        if ( junc->emitter == nullptr ) return false;
    }
    junc->emitter->flowCoeff = c;
    junc->emitter->expon = e;
    junc->emitter->timePattern = p;
    return true;
}